

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::DescriptorProto::DescriptorProto
          (DescriptorProto *this,DescriptorProto *param_1)

{
  pointer pcVar1;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__DescriptorProto_003c6d68;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (param_1->name_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + (param_1->name_)._M_string_length);
  std::
  vector<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ::vector(&this->field_,&param_1->field_);
  std::
  vector<perfetto::protos::gen::FieldDescriptorProto,_std::allocator<perfetto::protos::gen::FieldDescriptorProto>_>
  ::vector(&this->extension_,&param_1->extension_);
  std::
  vector<perfetto::protos::gen::DescriptorProto,_std::allocator<perfetto::protos::gen::DescriptorProto>_>
  ::vector(&this->nested_type_,&param_1->nested_type_);
  std::
  vector<perfetto::protos::gen::EnumDescriptorProto,_std::allocator<perfetto::protos::gen::EnumDescriptorProto>_>
  ::vector(&this->enum_type_,&param_1->enum_type_);
  std::
  vector<perfetto::protos::gen::OneofDescriptorProto,_std::allocator<perfetto::protos::gen::OneofDescriptorProto>_>
  ::vector(&this->oneof_decl_,&param_1->oneof_decl_);
  std::
  vector<perfetto::protos::gen::DescriptorProto_ReservedRange,_std::allocator<perfetto::protos::gen::DescriptorProto_ReservedRange>_>
  ::vector(&this->reserved_range_,&param_1->reserved_range_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->reserved_name_,&param_1->reserved_name_);
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  pcVar1 = (param_1->unknown_fields_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->unknown_fields_,pcVar1,
             pcVar1 + (param_1->unknown_fields_)._M_string_length);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

DescriptorProto::DescriptorProto(const DescriptorProto&) = default;